

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O1

void __thiscall CSHA1::Final(CSHA1 *this)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  uchar finalcount [8];
  uchar local_20 [8];
  
  bVar2 = 0;
  uVar3 = 0;
  do {
    local_20[uVar3] = (uchar)(this->m_count[uVar3 < 4] >> (~bVar2 & 0x18));
    uVar3 = uVar3 + 1;
    bVar2 = bVar2 + 8;
  } while (uVar3 != 8);
  Update(this,(uchar *)anon_var_dwarf_d263a,1);
  uVar1 = this->m_count[0];
  while ((uVar1 & 0x1f8) != 0x1c0) {
    Update(this,(uchar *)"",1);
    uVar1 = this->m_count[0];
  }
  Update(this,local_20,8);
  bVar2 = 0;
  lVar4 = 0;
  do {
    this->m_digest[lVar4] =
         (uchar)(*(uint *)((long)this->m_state + (ulong)((uint)lVar4 & 0xfffffffc)) >>
                (~bVar2 & 0x18));
    lVar4 = lVar4 + 1;
    bVar2 = bVar2 + 8;
  } while (lVar4 != 0x14);
  this->m_buffer[0x30] = '\0';
  this->m_buffer[0x31] = '\0';
  this->m_buffer[0x32] = '\0';
  this->m_buffer[0x33] = '\0';
  this->m_buffer[0x34] = '\0';
  this->m_buffer[0x35] = '\0';
  this->m_buffer[0x36] = '\0';
  this->m_buffer[0x37] = '\0';
  this->m_buffer[0x38] = '\0';
  this->m_buffer[0x39] = '\0';
  this->m_buffer[0x3a] = '\0';
  this->m_buffer[0x3b] = '\0';
  this->m_buffer[0x3c] = '\0';
  this->m_buffer[0x3d] = '\0';
  this->m_buffer[0x3e] = '\0';
  this->m_buffer[0x3f] = '\0';
  this->m_buffer[0x20] = '\0';
  this->m_buffer[0x21] = '\0';
  this->m_buffer[0x22] = '\0';
  this->m_buffer[0x23] = '\0';
  this->m_buffer[0x24] = '\0';
  this->m_buffer[0x25] = '\0';
  this->m_buffer[0x26] = '\0';
  this->m_buffer[0x27] = '\0';
  this->m_buffer[0x28] = '\0';
  this->m_buffer[0x29] = '\0';
  this->m_buffer[0x2a] = '\0';
  this->m_buffer[0x2b] = '\0';
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x2d] = '\0';
  this->m_buffer[0x2e] = '\0';
  this->m_buffer[0x2f] = '\0';
  this->m_buffer[0x10] = '\0';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = '\0';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  this->m_buffer[0x18] = '\0';
  this->m_buffer[0x19] = '\0';
  this->m_buffer[0x1a] = '\0';
  this->m_buffer[0x1b] = '\0';
  this->m_buffer[0x1c] = '\0';
  this->m_buffer[0x1d] = '\0';
  this->m_buffer[0x1e] = '\0';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0] = '\0';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\0';
  this->m_buffer[3] = '\0';
  this->m_buffer[4] = '\0';
  this->m_buffer[5] = '\0';
  this->m_buffer[6] = '\0';
  this->m_buffer[7] = '\0';
  this->m_buffer[8] = '\0';
  this->m_buffer[9] = '\0';
  this->m_buffer[10] = '\0';
  this->m_buffer[0xb] = '\0';
  this->m_buffer[0xc] = '\0';
  this->m_buffer[0xd] = '\0';
  this->m_buffer[0xe] = '\0';
  this->m_buffer[0xf] = '\0';
  this->m_state[0] = 0;
  this->m_state[1] = 0;
  this->m_state[2] = 0;
  this->m_state[3] = 0;
  this->m_state[3] = 0;
  this->m_state[4] = 0;
  this->m_count[0] = 0;
  this->m_count[1] = 0;
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  local_20[4] = '\0';
  local_20[5] = '\0';
  local_20[6] = '\0';
  local_20[7] = '\0';
  Transform(this,this->m_state,this->m_buffer);
  return;
}

Assistant:

void CSHA1::Final()
{
	UINT_32 i;
	UINT_8 finalcount[8];

	for(i = 0; i < 8; i++)
		finalcount[i] = (UINT_8)((m_count[((i >= 4) ? 0 : 1)]
			>> ((3 - (i & 3)) * 8) ) & 255); // Endian independent

	Update((UINT_8 *)"\200", 1);

	while ((m_count[0] & 504) != 448)
		Update((UINT_8 *)"\0", 1);

	Update(finalcount, 8); // Cause a SHA1Transform()

	for(i = 0; i < 20; i++)
	{
		m_digest[i] = (UINT_8)((m_state[i >> 2] >> ((3 - (i & 3)) * 8) ) & 255);
	}

	// Wipe variables for security reasons
#ifdef SHA1_WIPE_VARIABLES
	i = 0;
	memset(m_buffer, 0, 64);
	memset(m_state, 0, 20);
	memset(m_count, 0, 8);
	memset(finalcount, 0, 8);
	Transform(m_state, m_buffer);
#endif
}